

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O0

Fra_Cla_t * Fra_ClassesStart(Aig_Man_t *pAig)

{
  int iVar1;
  Fra_Cla_t *__s;
  Aig_Obj_t **ppAVar2;
  Vec_Ptr_t *pVVar3;
  Fra_Cla_t *p;
  Aig_Man_t *pAig_local;
  
  __s = (Fra_Cla_t *)malloc(0x70);
  memset(__s,0,0x70);
  __s->pAig = pAig;
  iVar1 = Aig_ManObjNumMax(pAig);
  ppAVar2 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
  __s->pMemRepr = ppAVar2;
  ppAVar2 = __s->pMemRepr;
  iVar1 = Aig_ManObjNumMax(pAig);
  memset(ppAVar2,0,(long)iVar1 << 3);
  pVVar3 = Vec_PtrAlloc(100);
  __s->vClasses = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vClasses1 = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vClassesTemp = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vClassOld = pVVar3;
  pVVar3 = Vec_PtrAlloc(100);
  __s->vClassNew = pVVar3;
  __s->pFuncNodeHash = Fra_SmlNodeHash;
  __s->pFuncNodeIsConst = Fra_SmlNodeIsConst;
  __s->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
  return __s;
}

Assistant:

Fra_Cla_t * Fra_ClassesStart( Aig_Man_t * pAig )
{
    Fra_Cla_t * p;
    p = ABC_ALLOC( Fra_Cla_t, 1 );
    memset( p, 0, sizeof(Fra_Cla_t) );
    p->pAig = pAig;
    p->pMemRepr  = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    memset( p->pMemRepr, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(pAig) );
    p->vClasses     = Vec_PtrAlloc( 100 );
    p->vClasses1    = Vec_PtrAlloc( 100 );
    p->vClassesTemp = Vec_PtrAlloc( 100 );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->pFuncNodeHash      = Fra_SmlNodeHash;
    p->pFuncNodeIsConst   = Fra_SmlNodeIsConst;
    p->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    return p;
}